

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall ON_BoundingBox::SwapCoordinates(ON_BoundingBox *this,int i,int j)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  ON_3dPoint *this_00;
  
  bVar3 = IsNotEmpty(this);
  if (i != j && ((uint)j < 3 && ((uint)i < 3 && bVar3))) {
    pdVar4 = ON_3dPoint::operator[](&this->m_min,i);
    dVar1 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](&this->m_min,j);
    dVar2 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](&this->m_min,i);
    *pdVar4 = dVar2;
    pdVar4 = ON_3dPoint::operator[](&this->m_min,j);
    *pdVar4 = dVar1;
    this_00 = &this->m_max;
    pdVar4 = ON_3dPoint::operator[](this_00,i);
    dVar1 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](this_00,j);
    dVar2 = *pdVar4;
    pdVar4 = ON_3dPoint::operator[](this_00,i);
    *pdVar4 = dVar2;
    pdVar4 = ON_3dPoint::operator[](this_00,j);
    *pdVar4 = dVar1;
  }
  return (uint)j < 3 && ((uint)i < 3 && bVar3);
}

Assistant:

bool ON_BoundingBox::SwapCoordinates( int i, int j )
{
  bool rc = false;
  if ( IsValid() && 0 <= i && i < 3 && 0 <= j && j < 3 ) {
    rc = true;
    if ( i != j ) {
      double t = m_min[i]; m_min[i] = m_min[j]; m_min[j] = t;
      t = m_max[i]; m_max[i] = m_max[j]; m_max[j] = t;
    }
  }
  return rc;
}